

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_0::generateRandomFrame
               (Frame *dst,
               vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *drawTypes,Random *rnd)

{
  pointer *ppDVar1;
  DrawType DVar2;
  pointer pDVar3;
  pointer __n;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  ulong uVar8;
  pointer pDVar9;
  pointer pDVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
  *this;
  int iVar16;
  pointer pDVar17;
  int iVar18;
  long lVar19;
  
  if ((drawTypes->
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (drawTypes->
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      iVar16 = dst->width + -1;
      iVar15 = dst->width + 6;
      if (-1 < iVar16) {
        iVar15 = iVar16;
      }
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      iVar13 = dVar5 % ((iVar15 >> 3) + 1U) << 2;
      iVar16 = dst->height + -1;
      iVar15 = dst->height + 6;
      if (-1 < iVar16) {
        iVar15 = iVar16;
      }
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      iVar14 = dVar5 % ((iVar15 >> 3) + 1U) << 2;
      iVar15 = dst->width;
      iVar16 = iVar15 + -1;
      iVar4 = iVar15 + 2;
      iVar15 = iVar15 + 6;
      if (-1 < iVar16) {
        iVar4 = iVar16;
        iVar15 = iVar16;
      }
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      iVar18 = (dVar5 % (((iVar4 >> 2) - (iVar15 >> 3)) + 1U) + (iVar15 >> 3)) * 4;
      iVar15 = dst->height;
      iVar16 = iVar15 + -1;
      iVar4 = iVar15 + 2;
      iVar15 = iVar15 + 6;
      if (-1 < iVar16) {
        iVar4 = iVar16;
        iVar15 = iVar16;
      }
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      iVar16 = (dVar5 % (((iVar4 >> 2) - (iVar15 >> 3)) + 1U) + (iVar15 >> 3)) * 4;
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      dVar6 = deRandom_getUint32(&rnd->m_rnd);
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      DVar2 = (drawTypes->
              super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar12];
      pDVar3 = (dst->draws).
               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pDVar3 == (dst->draws).
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (dst->draws).
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = (long)pDVar3 - (long)__n;
        if (lVar19 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar8 = (lVar19 >> 3) * -0x5555555555555555;
        uVar11 = uVar8;
        if (pDVar3 == __n) {
          uVar11 = 1;
        }
        this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                *)(uVar11 + uVar8);
        if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             *)0x555555555555554 < this) {
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)0x555555555555555;
        }
        if (CARRY8(uVar11,uVar8)) {
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)0x555555555555555;
        }
        pDVar9 = std::
                 _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ::_M_allocate(this,(size_t)__n);
        *(DrawType *)((long)pDVar9 + lVar19) = DVar2;
        *(int *)((long)pDVar9 + lVar19 + 4) = iVar13;
        *(int *)((long)pDVar9 + lVar19 + 8) = iVar14;
        *(int *)((long)pDVar9 + lVar19 + 0xc) = iVar18;
        *(int *)((long)pDVar9 + lVar19 + 0x10) = iVar16;
        *(uchar *)((long)pDVar9 + lVar19 + 0x14) = (uchar)dVar5;
        *(uchar *)((long)pDVar9 + lVar19 + 0x15) = (uchar)dVar6;
        *(uchar *)((long)pDVar9 + lVar19 + 0x16) = (uchar)dVar7;
        pDVar17 = pDVar9;
        for (pDVar10 = __n; pDVar3 != pDVar10; pDVar10 = pDVar10 + 1) {
          iVar16 = (pDVar10->rect).bottomLeft.m_data[0];
          pDVar17->drawType = pDVar10->drawType;
          (pDVar17->rect).bottomLeft.m_data[0] = iVar16;
          (pDVar17->rect).bottomLeft.m_data[1] = (pDVar10->rect).bottomLeft.m_data[1];
          (pDVar17->rect).topRight.m_data[0] = (pDVar10->rect).topRight.m_data[0];
          (pDVar17->rect).topRight.m_data[1] = (pDVar10->rect).topRight.m_data[1];
          lVar19 = 0x14;
          do {
            *(undefined1 *)((long)(pDVar17->rect).bottomLeft.m_data + lVar19 + -4) =
                 *(undefined1 *)((long)(pDVar10->rect).bottomLeft.m_data + lVar19 + -4);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x17);
          pDVar17 = pDVar17 + 1;
        }
        if (__n != (pointer)0x0) {
          operator_delete(__n,(long)(dst->draws).
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__n);
        }
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar9;
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar17 + 1;
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar9 + (long)this;
      }
      else {
        pDVar3->drawType = DVar2;
        (pDVar3->rect).bottomLeft.m_data[0] = iVar13;
        (pDVar3->rect).bottomLeft.m_data[1] = iVar14;
        (pDVar3->rect).topRight.m_data[0] = iVar18;
        (pDVar3->rect).topRight.m_data[1] = iVar16;
        (pDVar3->rect).color.m_data[0] = (uchar)dVar5;
        (pDVar3->rect).color.m_data[1] = (uchar)dVar6;
        (pDVar3->rect).color.m_data[2] = (uchar)dVar7;
        ppDVar1 = &(dst->draws).
                   super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(drawTypes->
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(drawTypes->
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void generateRandomFrame (Frame& dst, const vector<PartialUpdateTest::DrawType>& drawTypes, de::Random& rnd)
{
	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		const int			x1			= rnd.getInt(0, (dst.width-1)/8) * 4;
		const int			y1			= rnd.getInt(0, (dst.height-1)/8) * 4;
		const int			x2			= rnd.getInt((dst.width-1)/8, (dst.width-1)/4) * 4;
		const int			y2			= rnd.getInt((dst.height-1)/8, (dst.height-1)/4) * 4;
		const GLubyte		r			= rnd.getUint8();
		const GLubyte		g			= rnd.getUint8();
		const GLubyte		b			= rnd.getUint8();
		const ColoredRect	coloredRect	(IVec2(x1, y1), IVec2(x2, y2), Color(r, g, b));
		const DrawCommand	drawCommand	(drawTypes[ndx], coloredRect);

		dst.draws.push_back(drawCommand);
	}
}